

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporaryObject.cpp
# Opt level: O0

void __thiscall chatra::TemporaryObject::setScopeRef(TemporaryObject *this,Reference targetRef)

{
  TemporaryObject *this_local;
  Reference targetRef_local;
  
  this->type = ScopeRef;
  this_local = (TemporaryObject *)targetRef.node;
  Reference::operator=(&this->targetRef,(Reference *)&this_local);
  clearRestrictions(this);
  return;
}

Assistant:

void TemporaryObject::setScopeRef(Reference targetRef) {
	type = Type::ScopeRef;
	this->targetRef = targetRef;
	clearRestrictions();
}